

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O0

ktx_error_code_e ktxFileStream_setpos(ktxStream *str,ktx_off_t pos)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  ktx_error_code_e result;
  ktx_size_t fileSize;
  long local_20;
  long local_18;
  long local_10;
  ktx_error_code_e local_4;
  
  if (in_RDI == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    if (*(int *)(in_RDI + 0x38) != 1) {
      __assert_fail("str->type == eStreamTypeFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                    ,0xff,"ktx_error_code_e ktxFileStream_setpos(ktxStream *, ktx_off_t)");
    }
    if (*(long *)(in_RDI + 0x40) == _stdin) {
      if (*(long *)(in_RDI + 0x58) < in_RSI) {
        local_4 = (**(code **)(in_RDI + 8))(in_RDI,in_RSI - *(long *)(in_RDI + 0x58));
      }
      else {
        local_4 = KTX_FILE_ISPIPE;
      }
    }
    else {
      local_18 = in_RSI;
      local_10 = in_RDI;
      local_4 = (**(code **)(in_RDI + 0x28))(in_RDI,&local_20);
      if (local_4 == KTX_SUCCESS) {
        if (local_20 < local_18) {
          local_4 = KTX_INVALID_OPERATION;
        }
        else {
          iVar1 = fseeko(*(FILE **)(local_10 + 0x40),local_18,0);
          if (iVar1 < 0) {
            local_4 = KTX_FILE_SEEK_ERROR;
          }
          else {
            local_4 = KTX_SUCCESS;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static
KTX_error_code ktxFileStream_setpos(ktxStream* str, ktx_off_t pos)
{
    ktx_size_t fileSize;
    KTX_error_code result;

    if (!str)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    if (str->data.file == stdin) {
        if (pos > str->readpos)
            return str->skip(str, pos - str->readpos);
        else
            return KTX_FILE_ISPIPE;
    }

    result = str->getsize(str, &fileSize);

    if (result != KTX_SUCCESS) {
        // Device is likely not seekable.
        return result;
    }

    if (pos > (ktx_off_t)fileSize)
        return KTX_INVALID_OPERATION;

    if (fseeko(str->data.file, pos, SEEK_SET) < 0)
            return KTX_FILE_SEEK_ERROR;
    else
            return KTX_SUCCESS;
}